

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
kj::Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>::Maybe
          (Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *this,
          Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *other)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  byte bVar4;
  
  bVar4 = (other->ptr).isSet;
  (this->ptr).isSet = (bool)bVar4;
  if ((bool)bVar4 == true) {
    bVar4 = (other->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.isSet
    ;
    (this->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.isSet =
         (bool)bVar4;
    if ((bool)bVar4 == true) {
      (this->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.field_1 =
           (other->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.
           field_1;
      bVar4 = (other->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.
              isSet;
    }
    if ((bVar4 & 1) != 0) {
      (other->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.isSet =
           false;
    }
    *(undefined8 *)((long)&(this->ptr).field_1 + 8) =
         *(undefined8 *)((long)&(other->ptr).field_1 + 8);
    *(undefined8 *)((long)&(this->ptr).field_1 + 0x10) =
         *(undefined8 *)((long)&(other->ptr).field_1 + 0x10);
    *(undefined8 *)((long)&(this->ptr).field_1 + 0x18) =
         *(undefined8 *)((long)&(other->ptr).field_1 + 0x18);
    *(undefined8 *)((long)&(other->ptr).field_1 + 8) = 0;
    *(undefined8 *)((long)&(other->ptr).field_1 + 0x10) = 0;
    bVar4 = (other->ptr).isSet;
  }
  if ((bVar4 & 1) != 0) {
    (other->ptr).isSet = false;
    lVar1 = *(long *)((long)&(other->ptr).field_1 + 8);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&(other->ptr).field_1 + 0x10);
      *(undefined8 *)((long)&(other->ptr).field_1 + 8) = 0;
      *(undefined8 *)((long)&(other->ptr).field_1 + 0x10) = 0;
      puVar3 = *(undefined8 **)((long)&(other->ptr).field_1 + 0x18);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }